

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerQueue.cpp
# Opt level: O0

void __thiscall
mario::TimerQueue::reset
          (TimerQueue *this,
          vector<std::pair<mario::Timestamp,_mario::Timer_*>,_std::allocator<std::pair<mario::Timestamp,_mario::Timer_*>_>_>
          *expired,Timestamp now)

{
  Timer *this_00;
  bool bVar1;
  pointer ppVar2;
  pointer ppVar3;
  pointer ppVar4;
  bool local_89;
  _Rb_tree_const_iterator<std::pair<mario::Timestamp,_mario::Timer_*>_> local_78;
  int64_t local_70;
  int64_t local_68;
  _Self local_60;
  _Self local_58;
  int64_t local_50;
  undefined1 local_48 [8];
  ActiveTimer timer;
  __normal_iterator<const_std::pair<mario::Timestamp,_mario::Timer_*>_*,_std::vector<std::pair<mario::Timestamp,_mario::Timer_*>,_std::allocator<std::pair<mario::Timestamp,_mario::Timer_*>_>_>_>
  local_30;
  const_iterator it;
  Timestamp nextExpire;
  vector<std::pair<mario::Timestamp,_mario::Timer_*>,_std::allocator<std::pair<mario::Timestamp,_mario::Timer_*>_>_>
  *expired_local;
  TimerQueue *this_local;
  Timestamp now_local;
  
  Timestamp::Timestamp((Timestamp *)&it);
  local_30._M_current =
       (pair<mario::Timestamp,_mario::Timer_*> *)
       std::
       vector<std::pair<mario::Timestamp,_mario::Timer_*>,_std::allocator<std::pair<mario::Timestamp,_mario::Timer_*>_>_>
       ::cbegin(expired);
  while( true ) {
    timer.second = (long)std::
                         vector<std::pair<mario::Timestamp,_mario::Timer_*>,_std::allocator<std::pair<mario::Timestamp,_mario::Timer_*>_>_>
                         ::cend(expired);
    bVar1 = __gnu_cxx::operator!=
                      (&local_30,
                       (__normal_iterator<const_std::pair<mario::Timestamp,_mario::Timer_*>_*,_std::vector<std::pair<mario::Timestamp,_mario::Timer_*>,_std::allocator<std::pair<mario::Timestamp,_mario::Timer_*>_>_>_>
                        *)&timer.second);
    if (!bVar1) break;
    ppVar2 = __gnu_cxx::
             __normal_iterator<const_std::pair<mario::Timestamp,_mario::Timer_*>_*,_std::vector<std::pair<mario::Timestamp,_mario::Timer_*>,_std::allocator<std::pair<mario::Timestamp,_mario::Timer_*>_>_>_>
             ::operator->(&local_30);
    ppVar3 = __gnu_cxx::
             __normal_iterator<const_std::pair<mario::Timestamp,_mario::Timer_*>_*,_std::vector<std::pair<mario::Timestamp,_mario::Timer_*>,_std::allocator<std::pair<mario::Timestamp,_mario::Timer_*>_>_>_>
             ::operator->(&local_30);
    local_50 = Timer::sequence(ppVar3->second);
    std::pair<mario::Timer_*,_long>::pair<long,_true>
              ((pair<mario::Timer_*,_long> *)local_48,&ppVar2->second,&local_50);
    ppVar2 = __gnu_cxx::
             __normal_iterator<const_std::pair<mario::Timestamp,_mario::Timer_*>_*,_std::vector<std::pair<mario::Timestamp,_mario::Timer_*>,_std::allocator<std::pair<mario::Timestamp,_mario::Timer_*>_>_>_>
             ::operator->(&local_30);
    bVar1 = Timer::repeat(ppVar2->second);
    local_89 = false;
    if (bVar1) {
      local_58._M_node =
           (_Base_ptr)
           std::
           set<std::pair<mario::Timer_*,_long>,_std::less<std::pair<mario::Timer_*,_long>_>,_std::allocator<std::pair<mario::Timer_*,_long>_>_>
           ::find(&this->_cancelingTimers,(key_type *)local_48);
      local_60._M_node =
           (_Base_ptr)
           std::
           set<std::pair<mario::Timer_*,_long>,_std::less<std::pair<mario::Timer_*,_long>_>,_std::allocator<std::pair<mario::Timer_*,_long>_>_>
           ::end(&this->_cancelingTimers);
      local_89 = std::operator==(&local_58,&local_60);
    }
    if (local_89 == false) {
      ppVar2 = __gnu_cxx::
               __normal_iterator<const_std::pair<mario::Timestamp,_mario::Timer_*>_*,_std::vector<std::pair<mario::Timestamp,_mario::Timer_*>,_std::allocator<std::pair<mario::Timestamp,_mario::Timer_*>_>_>_>
               ::operator->(&local_30);
      this_00 = ppVar2->second;
      if (this_00 != (Timer *)0x0) {
        Timer::~Timer(this_00);
        operator_delete(this_00);
      }
    }
    else {
      ppVar2 = __gnu_cxx::
               __normal_iterator<const_std::pair<mario::Timestamp,_mario::Timer_*>_*,_std::vector<std::pair<mario::Timestamp,_mario::Timer_*>,_std::allocator<std::pair<mario::Timestamp,_mario::Timer_*>_>_>_>
               ::operator->(&local_30);
      local_68 = now._microSecondsSinceEpoch;
      Timer::restart(ppVar2->second,now);
      ppVar2 = __gnu_cxx::
               __normal_iterator<const_std::pair<mario::Timestamp,_mario::Timer_*>_*,_std::vector<std::pair<mario::Timestamp,_mario::Timer_*>,_std::allocator<std::pair<mario::Timestamp,_mario::Timer_*>_>_>_>
               ::operator->(&local_30);
      insert(this,ppVar2->second);
    }
    __gnu_cxx::
    __normal_iterator<const_std::pair<mario::Timestamp,_mario::Timer_*>_*,_std::vector<std::pair<mario::Timestamp,_mario::Timer_*>,_std::allocator<std::pair<mario::Timestamp,_mario::Timer_*>_>_>_>
    ::operator++(&local_30);
  }
  bVar1 = std::
          set<std::pair<mario::Timestamp,_mario::Timer_*>,_std::less<std::pair<mario::Timestamp,_mario::Timer_*>_>,_std::allocator<std::pair<mario::Timestamp,_mario::Timer_*>_>_>
          ::empty(&this->_timers);
  if (!bVar1) {
    local_78._M_node =
         (_Base_ptr)
         std::
         set<std::pair<mario::Timestamp,_mario::Timer_*>,_std::less<std::pair<mario::Timestamp,_mario::Timer_*>_>,_std::allocator<std::pair<mario::Timestamp,_mario::Timer_*>_>_>
         ::begin(&this->_timers);
    ppVar4 = std::_Rb_tree_const_iterator<std::pair<mario::Timestamp,_mario::Timer_*>_>::operator->
                       (&local_78);
    local_70 = (int64_t)Timer::expiration(ppVar4->second);
    it._M_current = (pair<mario::Timestamp,_mario::Timer_*> *)local_70;
  }
  bVar1 = Timestamp::valid((Timestamp *)&it);
  if (bVar1) {
    detail::resetTimerfd(this->_timerfd,(Timestamp)it._M_current);
  }
  return;
}

Assistant:

void TimerQueue::reset(const std::vector<Entry>& expired, Timestamp now) {
    Timestamp nextExpire;

    for (auto it = expired.cbegin(); it != expired.cend(); ++it) {
        ActiveTimer timer(it->second, it->second->sequence());
        if (it->second->repeat() && _cancelingTimers.find(timer) == _cancelingTimers.end()) {
            it->second->restart(now);
            insert(it->second);
        } else {
            delete it->second;
        }
    }

    if (!_timers.empty()) {
        nextExpire = _timers.begin()->second->expiration();
    }
    if (nextExpire.valid()) {
        resetTimerfd(_timerfd, nextExpire);
    }
}